

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
absl::container_internal::
btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>
::value_init<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>*>
          (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>
           *this,field_type i,allocator_type *alloc,
          unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_> **args)

{
  unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_> *puVar1;
  CopyConst<char,_ElementType<3UL>_> *pCVar2;
  undefined7 in_register_00000031;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  local_50 = 1;
  uStack_48 = 0;
  uStack_40 = 4;
  uStack_38 = 0x1e;
  local_30 = 0x1f;
  internal_layout::
  LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>*,unsigned_int,unsigned_char,std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>*>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>>
  ::Pointer<3ul,char>((LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>*,unsigned_int,unsigned_char,std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>*>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>>
                       *)&local_50,(char *)this);
  local_50 = 1;
  uStack_48 = 0;
  uStack_40 = 4;
  uStack_38 = 0x1e;
  local_30 = 0x1f;
  pCVar2 = internal_layout::
           LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>*,unsigned_int,unsigned_char,std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>*>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>>
           ::Pointer<3ul,char>((LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>*,unsigned_int,unsigned_char,std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>*>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>>
                                *)&local_50,(char *)this);
  puVar1 = *args;
  pCVar2[CONCAT71(in_register_00000031,i) & 0xffffffff]._M_t.
  super___uniq_ptr_impl<SeqEntry,_std::default_delete<SeqEntry>_>._M_t.
  super__Tuple_impl<0UL,_SeqEntry_*,_std::default_delete<SeqEntry>_>.
  super__Head_base<0UL,_SeqEntry_*,_false>._M_head_impl =
       (puVar1->_M_t).super___uniq_ptr_impl<SeqEntry,_std::default_delete<SeqEntry>_>._M_t.
       super__Tuple_impl<0UL,_SeqEntry_*,_std::default_delete<SeqEntry>_>.
       super__Head_base<0UL,_SeqEntry_*,_false>._M_head_impl;
  (puVar1->_M_t).super___uniq_ptr_impl<SeqEntry,_std::default_delete<SeqEntry>_>._M_t.
  super__Tuple_impl<0UL,_SeqEntry_*,_std::default_delete<SeqEntry>_>.
  super__Head_base<0UL,_SeqEntry_*,_false>._M_head_impl = (SeqEntry *)0x0;
  return;
}

Assistant:

void value_init(const field_type i, allocator_type *alloc, Args &&... args) {
    next_generation();
    absl::container_internal::SanitizerUnpoisonObject(slot(i));
    params_type::construct(alloc, slot(i), std::forward<Args>(args)...);
  }